

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> **value)

{
  int iVar1;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> **ppSVar2;
  int i;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> **value_local;
  int *key_local;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<int>(this,key);
  if (-1 < iVar1) {
    ppSVar2 = anon_unknown_5::
              ValueEntry<SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>_>
              ::Value((ValueEntry<SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*>_>
                       *)(this->entries + iVar1));
    *value = *ppSVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }